

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

atomic<google::protobuf::internal::SerialArena_*> * __thiscall
google::protobuf::internal::ThreadSafeArena::SerialArenaChunk::arena
          (SerialArenaChunk *this,uint32_t i)

{
  Nonnull<const_char_*> pcVar1;
  
  if (((ulong)this & 7) != 0) {
    __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/layout.h"
                  ,0x1fe,
                  "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<google::protobuf::internal::SerialArenaChunkHeader, std::atomic<void *>, std::atomic<google::protobuf::internal::SerialArena *>>, std::integer_sequence<unsigned long, 1>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0>, std::integer_sequence<unsigned long, 0, 1>>::Pointer(Char *) const [Elements = std::tuple<google::protobuf::internal::SerialArenaChunkHeader, std::atomic<void *>, std::atomic<google::protobuf::internal::SerialArena *>>, StaticSizeSeq = std::integer_sequence<unsigned long, 1>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long, 0>, OffsetSeq = std::integer_sequence<unsigned long, 0, 1>, N = 0UL, Char = const char]"
                 );
  }
  if (i < *(uint *)(this + 8)) {
    pcVar1 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar1 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       ((ulong)i,(ulong)*(uint *)(this + 8),"i < capacity()");
  }
  if (pcVar1 == (Nonnull<const_char_*>)0x0) {
    return (atomic<google::protobuf::internal::SerialArena_*> *)
           (this + (ulong)i * 8 + (ulong)*(uint *)(this + 8) * 8 + 0x10);
  }
  arena();
}

Assistant:

const std::atomic<SerialArena*>& arena(uint32_t i) const {
    ABSL_DCHECK_LT(i, capacity());
    return Layout().Pointer<kArenas>(ptr())[i];
  }